

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotated_binary_text_gen.h
# Opt level: O0

void __thiscall
flatbuffers::AnnotatedBinaryTextGenerator::AnnotatedBinaryTextGenerator
          (AnnotatedBinaryTextGenerator *this,Options *options,
          map<unsigned_long,_flatbuffers::BinarySection,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
          *annotations,uint8_t *binary,int64_t binary_length)

{
  int64_t binary_length_local;
  uint8_t *binary_local;
  map<unsigned_long,_flatbuffers::BinarySection,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
  *annotations_local;
  Options *options_local;
  AnnotatedBinaryTextGenerator *this_local;
  
  std::
  map<unsigned_long,_flatbuffers::BinarySection,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
  ::map(&this->annotations_,annotations);
  this->binary_ = binary;
  this->binary_length_ = binary_length;
  Options::Options(&this->options_,options);
  return;
}

Assistant:

explicit AnnotatedBinaryTextGenerator(
      const Options &options, std::map<uint64_t, BinarySection> annotations,
      const uint8_t *const binary, const int64_t binary_length)
      : annotations_(std::move(annotations)),
        binary_(binary),
        binary_length_(binary_length),
        options_(options) {}